

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-poll.c
# Opt level: O2

int run_test_fs_poll_close_request_multi_start_stop(void)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  int64_t eval_b;
  int64_t eval_b_1;
  uv_fs_poll_t poll_handle;
  uv_loop_t loop;
  
  remove("testfile");
  iVar1 = uv_loop_init(&loop);
  eval_b = (int64_t)iVar1;
  poll_handle.data = (void *)eval_b;
  if ((void *)eval_b == (void *)0x0) {
    iVar1 = uv_fs_poll_init(&loop,&poll_handle);
    eval_b = (int64_t)iVar1;
    eval_b_1 = 0;
    if ((void *)eval_b == (void *)0x0) {
      iVar1 = 10;
      do {
        bVar6 = iVar1 == 0;
        iVar1 = iVar1 + -1;
        if (bVar6) {
          uv_close(&poll_handle,close_cb);
          while (eval_b_1 = (int64_t)close_cb_called, eval_b_1 == 0) {
            uv_run(&loop,1);
          }
          eval_b = 1;
          if (eval_b_1 == 1) {
            close_loop(&loop);
            eval_b = 0;
            iVar1 = uv_loop_close(&loop);
            eval_b_1 = (int64_t)iVar1;
            if (eval_b_1 == 0) {
              uv_library_shutdown();
              return 0;
            }
            pcVar5 = "uv_loop_close(&loop)";
            pcVar4 = "0";
            uVar3 = 0xef;
          }
          else {
            pcVar5 = "close_cb_called";
            pcVar4 = "1";
            uVar3 = 0xed;
          }
          goto LAB_001245e2;
        }
        iVar2 = uv_fs_poll_start(&poll_handle,poll_cb_fail,"testfile",100);
        eval_b = (int64_t)iVar2;
        eval_b_1 = 0;
        if ((void *)eval_b != (void *)0x0) {
          pcVar5 = "0";
          pcVar4 = "uv_fs_poll_start(&poll_handle, poll_cb_fail, \"testfile\", 100)";
          uVar3 = 0xe7;
          goto LAB_001245e2;
        }
        iVar2 = uv_fs_poll_stop(&poll_handle);
        eval_b = (int64_t)iVar2;
        eval_b_1 = 0;
      } while ((void *)eval_b == (void *)0x0);
      pcVar5 = "0";
      pcVar4 = "uv_fs_poll_stop(&poll_handle)";
      uVar3 = 0xe8;
    }
    else {
      pcVar5 = "0";
      pcVar4 = "uv_fs_poll_init(&loop, &poll_handle)";
      uVar3 = 0xe4;
    }
  }
  else {
    pcVar5 = "0";
    pcVar4 = "uv_loop_init(&loop)";
    uVar3 = 0xe2;
    eval_b_1 = 0;
  }
LAB_001245e2:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-poll.c"
          ,uVar3,pcVar4,"==",pcVar5,eval_b,"==",eval_b_1);
  abort();
}

Assistant:

TEST_IMPL(fs_poll_close_request_multi_start_stop) {
  uv_loop_t loop;
  uv_fs_poll_t poll_handle;
  int i;

  remove(FIXTURE);

  ASSERT_OK(uv_loop_init(&loop));

  ASSERT_OK(uv_fs_poll_init(&loop, &poll_handle));

  for (i = 0; i < 10; ++i) {
    ASSERT_OK(uv_fs_poll_start(&poll_handle, poll_cb_fail, FIXTURE, 100));
    ASSERT_OK(uv_fs_poll_stop(&poll_handle));
  }
  uv_close((uv_handle_t*) &poll_handle, close_cb);
  while (close_cb_called == 0)
    uv_run(&loop, UV_RUN_ONCE);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(&loop);
  return 0;
}